

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsLinSys(realtype t,N_Vector y,N_Vector fy,SUNMatrix A,int jok,int *jcur,realtype gamma,
              void *cvode_mem,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  SUNLinearSolver_Type SVar2;
  int iVar3;
  SUNMatrix B;
  SUNMatrix A_00;
  CVodeMem local_50;
  CVLsMem local_48;
  realtype local_40;
  realtype local_38;
  
  local_40 = t;
  local_38 = gamma;
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsLinSys",&local_50,&local_48);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (jok == 0) {
    *jcur = 1;
    SVar2 = SUNLinSolGetType(local_48->LS);
    if ((SVar2 != SUNLINEARSOLVER_DIRECT) || (iVar1 = SUNMatZero(A), iVar1 == 0)) {
      iVar1 = (*local_48->jac)(local_40,y,fy,A,local_48->J_data,vtemp1,vtemp2,vtemp3);
      if (iVar1 < 0) {
        iVar3 = -6;
        cvProcessError(local_50,-6,"CVLS","cvLsSetup",
                       "The Jacobian routine failed in an unrecoverable manner.");
        iVar1 = -1;
        goto LAB_004fd046;
      }
      if (iVar1 != 0) {
        iVar1 = 1;
        iVar3 = -7;
        goto LAB_004fd046;
      }
      B = local_48->savedJ;
      A_00 = A;
      goto LAB_004fcf81;
    }
  }
  else {
    *jcur = 0;
    B = A;
    A_00 = local_48->savedJ;
LAB_004fcf81:
    iVar1 = SUNMatCopy(A_00,B);
    if ((iVar1 == 0) && (iVar1 = SUNMatScaleAddI(-local_38,A), iVar1 == 0)) {
      return 0;
    }
  }
  iVar3 = -8;
  cvProcessError(local_50,-8,"CVLS","cvLsSetup",
                 "A SUNMatrix routine failed in an unrecoverable manner.");
  iVar1 = -8;
LAB_004fd046:
  local_48->last_flag = iVar3;
  return iVar1;
}

Assistant:

static int cvLsLinSys(realtype t, N_Vector y, N_Vector fy, SUNMatrix A,
                      booleantype jok, booleantype *jcur, realtype gamma,
                      void *cvode_mem, N_Vector vtemp1, N_Vector vtemp2,
                      N_Vector vtemp3)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "cvLsLinSys",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* Check if Jacobian needs to be updated */
  if (jok) {

    /* Use saved copy of J */
    *jcur = SUNFALSE;

    /* Overwrite linear system matrix with saved J */
    retval = SUNMatCopy(cvls_mem->savedJ, A);
    if (retval) {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, "CVLS",
                     "cvLsSetup",  MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return(cvls_mem->last_flag);
    }

  } else {

    /* Call jac() routine to update J */
    *jcur = SUNTRUE;

    /* Clear the linear system matrix if necessary */
    if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_DIRECT) {
      retval = SUNMatZero(A);
      if (retval) {
        cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, "CVLS",
                       "cvLsSetup",  MSG_LS_SUNMAT_FAILED);
        cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
        return(cvls_mem->last_flag);
      }
    }

    /* Compute new Jacobian matrix */
    retval = cvls_mem->jac(t, y, fy, A, cvls_mem->J_data,
                           vtemp1, vtemp2, vtemp3);
    if (retval < 0) {
      cvProcessError(cv_mem, CVLS_JACFUNC_UNRECVR, "CVLS",
                     "cvLsSetup",  MSG_LS_JACFUNC_FAILED);
      cvls_mem->last_flag = CVLS_JACFUNC_UNRECVR;
      return(-1);
    }
    if (retval > 0) {
      cvls_mem->last_flag = CVLS_JACFUNC_RECVR;
      return(1);
    }

    /* Update saved copy of the Jacobian matrix */
    retval = SUNMatCopy(A, cvls_mem->savedJ);
    if (retval) {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, "CVLS",
                     "cvLsSetup",  MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return(cvls_mem->last_flag);
    }

  }

  /* Perform linear combination A = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, A);
  if (retval) {
    cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, "CVLS",
                   "cvLsSetup",  MSG_LS_SUNMAT_FAILED);
    cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
    return(cvls_mem->last_flag);
  }

  return(CVLS_SUCCESS);
}